

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  ushort uVar1;
  stbi__context *psVar2;
  byte *pbVar3;
  stbi_uc *psVar4;
  byte bVar5;
  stbi_uc sVar6;
  byte bVar7;
  sbyte sVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  stbi_uc *psVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  long lVar17;
  bool bVar18;
  uint local_b8 [2];
  int sizes [16];
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      uVar9 = stbi__get16be(z->s);
      iVar10 = uVar9 - 2;
      if (2 < uVar9) {
        do {
          psVar2 = z->s;
          pbVar3 = psVar2->img_buffer;
          if (pbVar3 < psVar2->img_buffer_end) {
            psVar2->img_buffer = pbVar3 + 1;
            bVar5 = *pbVar3;
          }
          else if (psVar2->read_from_callbacks == 0) {
            bVar5 = 0;
          }
          else {
            psVar4 = psVar2->buffer_start;
            iVar11 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar4,psVar2->buflen);
            if (iVar11 == 0) {
              psVar2->read_from_callbacks = 0;
              psVar12 = psVar2->buffer_start + 1;
              psVar2->buffer_start[0] = '\0';
              bVar5 = 0;
            }
            else {
              psVar12 = psVar4 + iVar11;
              bVar5 = *psVar4;
            }
            psVar2->img_buffer_end = psVar12;
            psVar2->img_buffer = psVar2->buffer_start + 1;
          }
          if ((0x1f < bVar5) || (bVar16 = bVar5 & 0xf, 3 < bVar16)) {
            stbi__g_failure_reason = "bad DHT header";
            goto LAB_00119b35;
          }
          lVar17 = 0;
          uVar9 = 0;
          do {
            psVar2 = z->s;
            pbVar3 = psVar2->img_buffer;
            if (pbVar3 < psVar2->img_buffer_end) {
              psVar2->img_buffer = pbVar3 + 1;
              bVar7 = *pbVar3;
            }
            else if (psVar2->read_from_callbacks == 0) {
              bVar7 = 0;
            }
            else {
              psVar4 = psVar2->buffer_start;
              iVar11 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar4,psVar2->buflen);
              if (iVar11 == 0) {
                psVar2->read_from_callbacks = 0;
                psVar12 = psVar2->buffer_start + 1;
                psVar2->buffer_start[0] = '\0';
                bVar7 = 0;
              }
              else {
                psVar12 = psVar4 + iVar11;
                bVar7 = *psVar4;
              }
              psVar2->img_buffer_end = psVar12;
              psVar2->img_buffer = psVar2->buffer_start + 1;
            }
            local_b8[lVar17] = (uint)bVar7;
            uVar9 = uVar9 + bVar7;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x10);
          if (bVar5 < 0x10) {
            iVar11 = stbi__build_huffman(z->huff_dc + bVar16,(int *)local_b8);
            lVar17 = 8;
          }
          else {
            iVar11 = stbi__build_huffman(z->huff_ac + bVar16,(int *)local_b8);
            lVar17 = 0x1a48;
          }
          if (iVar11 == 0) goto LAB_00119b35;
          if (uVar9 != 0) {
            uVar13 = 0;
            do {
              psVar2 = z->s;
              psVar4 = psVar2->img_buffer;
              if (psVar4 < psVar2->img_buffer_end) {
                psVar2->img_buffer = psVar4 + 1;
                sVar6 = *psVar4;
              }
              else if (psVar2->read_from_callbacks == 0) {
                sVar6 = '\0';
              }
              else {
                psVar4 = psVar2->buffer_start;
                iVar11 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar4,psVar2->buflen);
                if (iVar11 == 0) {
                  psVar2->read_from_callbacks = 0;
                  psVar12 = psVar2->buffer_start + 1;
                  psVar2->buffer_start[0] = '\0';
                  sVar6 = '\0';
                }
                else {
                  psVar12 = psVar4 + iVar11;
                  sVar6 = *psVar4;
                }
                psVar2->img_buffer_end = psVar12;
                psVar2->img_buffer = psVar2->buffer_start + 1;
              }
              z->huff_dc[bVar16].values[uVar13 + lVar17 + -8] = sVar6;
              uVar13 = uVar13 + 1;
            } while (uVar9 != uVar13);
          }
          if (0xf < bVar5) {
            lVar17 = 0;
            do {
              uVar13 = (ulong)z->huff_ac[bVar16].fast[lVar17];
              z->fast_ac[bVar16][lVar17] = 0;
              if (uVar13 != 0xff) {
                bVar5 = z->huff_ac[bVar16].values[uVar13];
                if ((bVar5 & 0xf) != 0) {
                  bVar7 = z->huff_ac[bVar16].size[uVar13];
                  uVar1 = (bVar5 & 0xf) + (ushort)bVar7;
                  if (uVar1 < 10) {
                    uVar15 = (int)lVar17 << (bVar7 & 0x1f) & 0x1ff;
                    sVar8 = (sbyte)(bVar5 & 0xf);
                    uVar14 = -1 << sVar8 | 1;
                    if (0xff < uVar15) {
                      uVar14 = 0;
                    }
                    iVar11 = uVar14 + (uVar15 >> (9U - sVar8 & 0x1f));
                    if ((char)iVar11 == iVar11) {
                      z->fast_ac[bVar16][lVar17] = (short)iVar11 * 0x100 | bVar5 & 0xfff0 | uVar1;
                    }
                  }
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != 0x200);
          }
          iVar10 = (iVar10 + -0x11) - uVar9;
        } while (0 < iVar10);
      }
    }
    else {
      if (m != 0xdb) {
LAB_0011975b:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          psVar2 = z->s;
          iVar10 = stbi__get16be(psVar2);
          stbi__skip(psVar2,iVar10 + -2);
          goto LAB_00119afe;
        }
        goto LAB_00119b35;
      }
      uVar9 = stbi__get16be(z->s);
      iVar10 = uVar9 - 2;
      iVar11 = iVar10;
      if (2 < uVar9) {
        do {
          psVar2 = z->s;
          pbVar3 = psVar2->img_buffer;
          if (pbVar3 < psVar2->img_buffer_end) {
            psVar2->img_buffer = pbVar3 + 1;
            bVar5 = *pbVar3;
LAB_00119677:
            if (0xf < bVar5) {
              stbi__g_failure_reason = "bad DQT type";
              goto LAB_00119b35;
            }
            if (3 < bVar5) {
              stbi__g_failure_reason = "bad DQT table";
              goto LAB_00119b35;
            }
          }
          else {
            if (psVar2->read_from_callbacks != 0) {
              psVar4 = psVar2->buffer_start;
              iVar10 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar4,psVar2->buflen);
              if (iVar10 == 0) {
                psVar2->read_from_callbacks = 0;
                psVar12 = psVar2->buffer_start + 1;
                psVar2->buffer_start[0] = '\0';
                bVar5 = 0;
              }
              else {
                psVar12 = psVar4 + iVar10;
                bVar5 = *psVar4;
              }
              psVar2->img_buffer_end = psVar12;
              psVar2->img_buffer = psVar2->buffer_start + 1;
              goto LAB_00119677;
            }
            bVar5 = 0;
          }
          lVar17 = 0;
          do {
            psVar2 = z->s;
            psVar4 = psVar2->img_buffer;
            if (psVar4 < psVar2->img_buffer_end) {
              psVar2->img_buffer = psVar4 + 1;
              sVar6 = *psVar4;
            }
            else if (psVar2->read_from_callbacks == 0) {
              sVar6 = '\0';
            }
            else {
              psVar4 = psVar2->buffer_start;
              iVar10 = (*(psVar2->io).read)(psVar2->io_user_data,(char *)psVar4,psVar2->buflen);
              if (iVar10 == 0) {
                psVar2->read_from_callbacks = 0;
                psVar12 = psVar2->buffer_start + 1;
                psVar2->buffer_start[0] = '\0';
                sVar6 = '\0';
              }
              else {
                psVar12 = psVar4 + iVar10;
                sVar6 = *psVar4;
              }
              psVar2->img_buffer_end = psVar12;
              psVar2->img_buffer = psVar2->buffer_start + 1;
            }
            z->dequant[bVar5][""[lVar17]] = sVar6;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x40);
          iVar10 = iVar11 + -0x41;
          bVar18 = 0x41 < iVar11;
          iVar11 = iVar10;
        } while (bVar18);
      }
    }
    bVar18 = iVar10 == 0;
  }
  else {
    if (m == 0xdd) {
      iVar10 = stbi__get16be(z->s);
      if (iVar10 == 4) {
        iVar10 = stbi__get16be(z->s);
        z->restart_interval = iVar10;
LAB_00119afe:
        bVar18 = true;
        goto LAB_00119b37;
      }
      stbi__g_failure_reason = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_0011975b;
      stbi__g_failure_reason = "expected marker";
    }
LAB_00119b35:
    bVar18 = false;
  }
LAB_00119b37:
  return (int)bVar18;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = stbi__get8(z->s);
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      stbi__skip(z->s, stbi__get16be(z->s)-2);
      return 1;
   }
   return 0;
}